

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O1

void __thiscall
spvtools::opt::IfConversion::HoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  Instruction *pIVar1;
  IRContext *pIVar2;
  DefUseManager *pDVar3;
  pointer pOVar4;
  uint **ppuVar5;
  Instruction *pIVar6;
  IfConversion *pIVar7;
  bool bVar8;
  char cVar9;
  uint32_t a;
  uint32_t b;
  BasicBlock *pBVar10;
  mapped_type *ppBVar11;
  uint **ppuVar12;
  pointer *__ptr;
  pointer pOVar13;
  Instruction *this_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  IfConversion *local_68;
  uint *local_60;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  
  pBVar10 = IRContext::get_instr_block((this->super_Pass).context_,inst);
  if (pBVar10 != (BasicBlock *)0x0) {
    if (target_block != (BasicBlock *)0x0) {
      pIVar1 = (pBVar10->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      b = 0;
      a = 0;
      if (pIVar1->has_result_id_ == true) {
        a = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      pIVar1 = (target_block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar1->has_result_id_ == true) {
        b = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      bVar8 = DominatorTree::Dominates((DominatorTree *)dominators,a,b);
      if (bVar8) {
        return;
      }
    }
    bVar8 = Instruction::IsOpcodeCodeMotionSafe(inst);
    if (!bVar8) {
      __assert_fail("inst->IsOpcodeCodeMotionSafe() && \"Trying to move an instruction that is not safe to move.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp"
                    ,0xfa,
                    "void spvtools::opt::IfConversion::HoistInstruction(Instruction *, BasicBlock *, DominatorAnalysis *)"
                   );
    }
    pIVar2 = (this->super_Pass).context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pDVar3 = (pIVar2->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    local_58._16_8_ = (Instruction *)0x0;
    uStack_40._0_1_ = false;
    uStack_40._1_7_ = 0;
    local_58._0_8_ = (_func_int **)0x0;
    local_58._8_8_ = (Instruction *)0x0;
    local_58._0_8_ = operator_new(0x20);
    *(IfConversion **)local_58._0_8_ = this;
    *(BasicBlock **)(local_58._0_8_ + 8) = target_block;
    *(DefUseManager **)(local_58._0_8_ + 0x10) = pDVar3;
    *(DominatorAnalysis **)(local_58._0_8_ + 0x18) = dominators;
    uStack_40 = std::
                _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:255:7)>
                ::_M_invoke;
    local_58._16_8_ =
         std::
         _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:255:7)>
         ::_M_manager;
    uStack_80 = 0;
    pcStack_70 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
               ::_M_manager;
    pOVar13 = (inst->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pOVar4 = (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_88._M_head_impl = (Instruction *)local_58;
    local_68 = this;
    if (pOVar13 != pOVar4) {
      do {
        bVar8 = spvIsInIdType(pOVar13->type);
        if (bVar8) {
          ppuVar5 = (uint **)(pOVar13->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar12 = &(pOVar13->words).small_data_;
          if (ppuVar5 != (uint **)0x0) {
            ppuVar12 = ppuVar5;
          }
          local_60 = *ppuVar12;
          if (local_78 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar9 = (*pcStack_70)(&local_88,&local_60);
          if (cVar9 == '\0') break;
        }
        pOVar13 = pOVar13 + 1;
      } while (pOVar13 != pOVar4);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,3);
    }
    pIVar7 = local_68;
    if ((Instruction *)local_58._16_8_ != (Instruction *)0x0) {
      (*(code *)local_58._16_8_)(local_58,local_58,3);
    }
    pIVar1 = (target_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar1 == (Instruction *)0x0) ||
       ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    pIVar1 = (target_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    pIVar6 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    this_00 = (Instruction *)0x0;
    if ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
      this_00 = pIVar6;
    }
    if (this_00->opcode_ != OpSelectionMerge) {
      this_00 = pIVar1;
    }
    if ((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
      __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xca,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar1 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar1 == (Instruction *)0x0) {
      __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xcc,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                   );
    }
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
    (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
    local_88._M_head_impl = inst;
    Instruction::InsertBefore
              (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)&local_88);
    if (local_88._M_head_impl != (Instruction *)0x0) {
      (*((local_88._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
    pIVar2 = (pIVar7->super_Pass).context_;
    if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      local_88._M_head_impl = inst;
      ppBVar11 = std::__detail::
                 _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pIVar2->instr_to_block_,&local_88._M_head_impl);
      *ppBVar11 = target_block;
    }
  }
  return;
}

Assistant:

void IfConversion::HoistInstruction(Instruction* inst, BasicBlock* target_block,
                                    DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return;
  }

  assert(inst->IsOpcodeCodeMotionSafe() &&
         "Trying to move an instruction that is not safe to move.");

  // First hoist all instructions it depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  inst->ForEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        HoistInstruction(operand_inst, target_block, dominators);
      });

  Instruction* insertion_pos = target_block->terminator();
  if ((insertion_pos)->PreviousNode()->opcode() == spv::Op::OpSelectionMerge) {
    insertion_pos = insertion_pos->PreviousNode();
  }
  inst->RemoveFromList();
  insertion_pos->InsertBefore(std::unique_ptr<Instruction>(inst));
  context()->set_instr_block(inst, target_block);
}